

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsole::set_obey_whitespace(CVmConsole *this,int f)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int ret;
  
  iVar1 = CVmFormatter::get_obey_whitespace(*(CVmFormatter **)(in_RDI + 8));
  CVmFormatter::set_obey_whitespace(*(CVmFormatter **)(in_RDI + 8),in_ESI);
  if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
    CVmFormatter::set_obey_whitespace(*(CVmFormatter **)(in_RDI + 0x10),in_ESI);
  }
  return iVar1;
}

Assistant:

int CVmConsole::set_obey_whitespace(int f)
{
    int ret;

    /* note the original display stream status */
    ret = disp_str_->get_obey_whitespace();

    /* set the stream status */
    disp_str_->set_obey_whitespace(f);
    if (log_enabled_)
        log_str_->set_obey_whitespace(f);

    /* return the original status of the display stream */
    return ret;
}